

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.h
# Opt level: O0

void __thiscall psy::C::TagDeclarationSymbol::~TagDeclarationSymbol(TagDeclarationSymbol *this)

{
  TagDeclarationSymbol *this_local;
  
  (this->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__TagDeclarationSymbol_00734178;
  std::
  vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ::~vector(&this->membDecls_);
  TypeDeclarationSymbol::~TypeDeclarationSymbol(&this->super_TypeDeclarationSymbol);
  return;
}

Assistant:

class PSY_C_API TagDeclarationSymbol : public TypeDeclarationSymbol
{
public:
    using Members = std::vector<const MemberDeclarationSymbol*>;

    //!@{
    /**
     * Cast \c this Symbol as a TagDeclarationSymbol.
     */
    virtual TagDeclarationSymbol* asTagTypeDeclaration() override { return this; }
    virtual const TagDeclarationSymbol* asTagTypeDeclaration() const override { return this; }
    //!@}

    /**
     * The TagDeclarationCategory of \c this TagDeclarationSymbol.
     */
    TagDeclarationCategory category() const;

    /**
     * The \a new \a type introduced by \c this TagDeclarationSymbol.
     */
    const TagType* introducedNewType() const;

    /**
     * The \a member of \c this TagDeclarationSymbol by the given \c name.
     */
    const MemberDeclarationSymbol* member(const Identifier* name) const;

    /**
     * The \a members of \c this TagDeclarationSymbol.
     */
    Members members() const;

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

protected:
    TagDeclarationSymbol(
            SymbolKind symK,
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope,
            TagType* tagTy);

    virtual const Identifier* denotingIdentifier() const override;

    Members membDecls_;
    void addMember(const MemberDeclarationSymbol* memb);
}